

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::free_all_blocks(jpeg_decoder *this)

{
  long in_RDI;
  mem_block *n;
  mem_block *b;
  undefined8 local_10;
  
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  local_10 = *(undefined8 **)(in_RDI + 200);
  while (local_10 != (undefined8 *)0x0) {
    local_10 = (undefined8 *)*local_10;
    jpgd_free((void *)0x131f89);
  }
  *(undefined8 *)(in_RDI + 200) = 0;
  return;
}

Assistant:

void jpeg_decoder::free_all_blocks() {
  m_pStream = NULL;
  for (mem_block* b = m_pMem_blocks; b;) {
    mem_block* n = b->m_pNext;
    jpgd_free(b);
    b = n;
  }
  m_pMem_blocks = NULL;
}